

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O1

cl_int xmrig::OclLib::release(cl_program program)

{
  cl_int ret;
  char *pcVar1;
  
  if (program == (cl_program)0x0) {
    ret = 0;
  }
  else {
    ret = (*pReleaseProgram)(program);
    if (ret != 0) {
      pcVar1 = OclError::toString(ret);
      Log::print(ERR,
                 "\x1b[45;1m\x1b[1;37m ocl \x1b[0m\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31m%s\x1b[0m"
                 ,pcVar1,"clReleaseProgram");
    }
  }
  return ret;
}

Assistant:

cl_int xmrig::OclLib::release(cl_program program) noexcept
{
    assert(pReleaseProgram != nullptr);

    if (program == nullptr) {
        return CL_SUCCESS;
    }

    LOG_REFS("%p %u ~program %s", program, getUint(program, CL_PROGRAM_REFERENCE_COUNT), getString(program, CL_PROGRAM_KERNEL_NAMES).data());

    const cl_int ret = pReleaseProgram(program);
    if (ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(ret), kReleaseProgram);
    }

    return ret;
}